

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O3

bool __thiscall create::SerialStream::startSensorStream(SerialStream *this)

{
  uint uVar1;
  size_t in_RCX;
  int in_R8D;
  uint8_t numPackets;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packetIDs;
  uint8_t local_32;
  value_type_conflict2 local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_32 = Data::getNumPackets((this->super_Serial).data.
                                 super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                );
  Data::getPacketIDs(&local_30,
                     (this->super_Serial).data.
                     super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&local_30,
             (const_iterator)
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_32);
  local_31 = 0x94;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
            (&local_30,
             (const_iterator)
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_31);
  Serial::send(&this->super_Serial,
               (int)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (void *)(ulong)(uint)((int)local_30.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)local_30.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),in_RCX,in_R8D);
  uVar1 = Data::getTotalDataBytes
                    ((this->super_Serial).data.
                     super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->expectedNumBytes = (char)uVar1 + local_32;
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool SerialStream::startSensorStream() {
    // Request from Create that we want a stream containing all packets
    const uint8_t numPackets = data->getNumPackets();
    std::vector<uint8_t> packetIDs = data->getPacketIDs();
    packetIDs.insert(packetIDs.begin(), numPackets);
    packetIDs.insert(packetIDs.begin(), OC_STREAM);

    // Start streaming data
    send(packetIDs.data(), packetIDs.size());

    expectedNumBytes = data->getTotalDataBytes() + numPackets;

    return true;
  }